

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::commoditizedUnit(string *unit_string,precise_unit actUnit,size_t *index)

{
  size_t sVar1;
  bool bVar2;
  uint32_t uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  precise_unit pVar8;
  double local_98;
  precise_unit actUnit_local;
  size_t local_80;
  string commodStr;
  string local_58;
  precise_unit local_38;
  
  uVar5 = actUnit._8_8_;
  actUnit_local.multiplier_ = actUnit.multiplier_;
  actUnit_local._8_8_ = uVar5;
  lVar4 = std::__cxx11::string::find((char)unit_string,0x7b);
  uVar6 = actUnit.multiplier_._0_4_;
  uVar7 = actUnit.multiplier_._4_4_;
  if (lVar4 != -1) {
    sVar1 = lVar4 + 1;
    local_80 = sVar1;
    segmentcheck(unit_string,'}',&local_80);
    if ((local_80 - sVar1 == 2) && ((unit_string->_M_dataplus)._M_p[sVar1] == '#')) {
      *index = local_80;
      pVar8 = precise_unit::operator*(&actUnit_local,(unit *)&count);
      uVar5 = pVar8._8_8_;
      uVar6 = pVar8.multiplier_._0_4_;
      uVar7 = pVar8.multiplier_._4_4_;
    }
    else {
      std::__cxx11::string::substr((ulong)&commodStr,(ulong)unit_string);
      bVar2 = std::operator==(&commodStr,"cells");
      if (bVar2) {
        *index = local_80;
        local_38.multiplier_ = 1.0;
        local_38.base_units_ = (unit_data)0x4000000;
        local_38.commodity_ = 0x604335a0;
        pVar8 = precise_unit::operator*(&actUnit_local,&local_38);
        uVar5 = pVar8._8_8_;
        local_98 = pVar8.multiplier_;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)commodStr._M_dataplus._M_p == &commodStr.field_2) {
          local_58.field_2._8_8_ = commodStr.field_2._8_8_;
        }
        else {
          local_58._M_dataplus._M_p = commodStr._M_dataplus._M_p;
        }
        local_58._M_string_length = commodStr._M_string_length;
        commodStr._M_string_length = 0;
        commodStr.field_2._M_local_buf[0] = '\0';
        commodStr._M_dataplus._M_p = (pointer)&commodStr.field_2;
        uVar3 = getCommodity(&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        *index = local_80;
        local_98 = actUnit_local.multiplier_;
        uVar5._4_4_ = uVar3 | actUnit_local.commodity_;
        uVar5._0_4_ = actUnit_local.base_units_;
      }
      std::__cxx11::string::~string((string *)&commodStr);
      uVar6 = SUB84(local_98,0);
      uVar7 = (undefined4)((ulong)local_98 >> 0x20);
    }
  }
  pVar8.multiplier_._4_4_ = uVar7;
  pVar8.multiplier_._0_4_ = uVar6;
  pVar8.base_units_ = SUB84(uVar5,0);
  pVar8.commodity_ = SUB84(uVar5,4);
  return pVar8;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}